

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlockfile_unix.cpp
# Opt level: O2

bool QLockFilePrivate::isProcessRunning(qint64 pid,QString *appname)

{
  bool bVar1;
  int iVar2;
  int *piVar3;
  long in_FS_OFFSET;
  QFileInfo fi;
  QArrayDataPointer<char16_t> QStack_68;
  QFileInfo local_50;
  QArrayDataPointer<char16_t> local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  iVar2 = kill((__pid_t)pid,0);
  if (iVar2 == -1) {
    piVar3 = __errno_location();
    if (*piVar3 == 3) {
      bVar1 = false;
      goto LAB_00379a95;
    }
  }
  local_48.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_48.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_48.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  processNameByPid((QString *)&local_48,pid);
  if ((undefined1 *)local_48.size == (undefined1 *)0x0) {
LAB_00379a89:
    bVar1 = true;
  }
  else {
    local_50.d_ptr.d.ptr = (QSharedDataPointer<QFileInfoPrivate>)&DAT_aaaaaaaaaaaaaaaa;
    QFileInfo::QFileInfo(&local_50,appname);
    bVar1 = QFileInfo::isSymLink(&local_50);
    if (bVar1) {
      QFileInfo::symLinkTarget((QString *)&QStack_68,&local_50);
      QFileInfo::setFile(&local_50,(QString *)&QStack_68);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&QStack_68);
    }
    QFileInfo::fileName((QString *)&QStack_68,&local_50);
    bVar1 = ::operator!=((QString *)&local_48,(QString *)&QStack_68);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&QStack_68);
    QFileInfo::~QFileInfo(&local_50);
    if (!bVar1) goto LAB_00379a89;
    bVar1 = false;
  }
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
LAB_00379a95:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool QLockFilePrivate::isProcessRunning(qint64 pid, const QString &appname)
{
    if (::kill(pid_t(pid), 0) == -1 && errno == ESRCH)
        return false; // PID doesn't exist anymore

    const QString processName = processNameByPid(pid);
    if (!processName.isEmpty()) {
        QFileInfo fi(appname);
        if (fi.isSymLink())
            fi.setFile(fi.symLinkTarget());
        if (processName != fi.fileName())
            return false;   // PID got reused by a different application.
    }

    return true;
}